

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_service_client(t_javame_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  t_function *tfunction;
  t_struct *ptVar2;
  t_type *ptVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  t_javame_generator *ptVar8;
  pointer pptVar9;
  pointer pptVar10;
  string resultname;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string funname;
  string extends;
  string argsname;
  string extends_client;
  t_struct noargs;
  t_function recv_function;
  t_function send_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  string local_538;
  string local_518;
  t_struct *local_4f8;
  string local_4f0;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_4d0;
  string local_4b8;
  string local_498 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string local_438 [32];
  t_struct local_418;
  string local_350;
  t_function local_330;
  t_function local_290;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_478,"",(allocator *)&local_418);
  std::__cxx11::string::string(local_438,"",(allocator *)&local_418);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_
              ((string *)&local_418,this,&tservice->extends_->super_t_type,false,false,false);
    std::__cxx11::string::operator=((string *)&local_478,(string *)&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_290,
                   " extends ",&local_478);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_418,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_290,
                   ".Client");
    std::__cxx11::string::operator=(local_438,(string *)&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_290);
  }
  os = &this->f_service_;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"public static class Client");
  poVar6 = std::operator<<(poVar6,local_438);
  poVar6 = std::operator<<(poVar6," implements TServiceClient, Iface {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"public Client(TProtocol prot)");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"this(prot, prot);");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"public Client(TProtocol iprot, TProtocol oprot)");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
  if (local_478._M_string_length == 0) {
    t_generator::indent_abi_cxx11_((string *)&local_418,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)os,(string *)&local_418);
    poVar6 = std::operator<<(poVar6,"iprot_ = iprot;");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&local_290,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_290);
    poVar6 = std::operator<<(poVar6,"oprot_ = oprot;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_290);
  }
  else {
    t_generator::indent_abi_cxx11_((string *)&local_418,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)os,(string *)&local_418);
    poVar6 = std::operator<<(poVar6,"super(iprot, oprot);");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_418);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  if (local_478._M_string_length == 0) {
    t_generator::indent_abi_cxx11_((string *)&local_418,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)os,(string *)&local_418);
    poVar6 = std::operator<<(poVar6,"protected TProtocol iprot_;");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&local_290,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_290);
    poVar6 = std::operator<<(poVar6,"protected TProtocol oprot_;");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&local_330,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_330);
    poVar6 = std::operator<<(poVar6,"protected int seqid_;");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_418);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar6 = std::operator<<(poVar6,"public TProtocol getInputProtocol()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar6 = std::operator<<(poVar6,"return this.iprot_;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar6 = std::operator<<(poVar6,"public TProtocol getOutputProtocol()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar6 = std::operator<<(poVar6,"return this.oprot_;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_4d0,&tservice->functions_
            );
  for (pptVar10 = local_4d0._M_impl.super__Vector_impl_data._M_start;
      pptVar10 != local_4d0._M_impl.super__Vector_impl_data._M_finish; pptVar10 = pptVar10 + 1) {
    std::__cxx11::string::string(local_498,(string *)&(*pptVar10)->name_);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar6 = std::operator<<(poVar6,"public ");
    tfunction = *pptVar10;
    std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&local_290);
    function_signature((string *)&local_418,this,tfunction,&local_b0);
    poVar6 = std::operator<<(poVar6,(string *)&local_418);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_b0);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar6 = std::operator<<(poVar6,"send_");
    poVar6 = std::operator<<(poVar6,local_498);
    std::operator<<(poVar6,"(");
    ptVar2 = (*pptVar10)->arglist_;
    bVar4 = true;
    for (pptVar9 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar9 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
      if (!bVar4) {
        std::operator<<((ostream *)os,", ");
      }
      std::operator<<((ostream *)os,(string *)&(*pptVar9)->name_);
      bVar4 = false;
    }
    poVar6 = std::operator<<((ostream *)os,");");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    if ((*pptVar10)->oneway_ == false) {
      t_generator::indent_abi_cxx11_((string *)&local_418,(t_generator *)this);
      std::operator<<((ostream *)os,(string *)&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      iVar5 = (*((*pptVar10)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar5 == '\0') {
        std::operator<<((ostream *)os,"return ");
      }
      poVar6 = std::operator<<((ostream *)os,"recv_");
      poVar6 = std::operator<<(poVar6,local_498);
      poVar6 = std::operator<<(poVar6,"();");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
    ptVar3 = g_type_void;
    std::__cxx11::string::string((string *)&local_418,"send_",(allocator *)&local_330);
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_418,
                   &(*pptVar10)->name_);
    t_function::t_function(&local_290,ptVar3,&local_50,(*pptVar10)->arglist_,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_418);
    std::operator+(&local_458,&(*pptVar10)->name_,"_args");
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar6 = std::operator<<(poVar6,"public ");
    std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&local_330);
    function_signature((string *)&local_418,this,&local_290,&local_d0);
    poVar6 = std::operator<<(poVar6,(string *)&local_418);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_d0);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
    t_generator::indent_abi_cxx11_((string *)&local_418,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)os,(string *)&local_418);
    poVar6 = std::operator<<(poVar6,"oprot_.writeMessageBegin(new TMessage(\"");
    poVar6 = std::operator<<(poVar6,local_498);
    poVar6 = std::operator<<(poVar6,"\", ");
    pcVar7 = "TMessageType.CALL";
    if ((*pptVar10)->oneway_ != false) {
      pcVar7 = "TMessageType.ONEWAY";
    }
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,", ++seqid_));");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&local_330,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_330);
    poVar6 = std::operator<<(poVar6,(string *)&local_458);
    poVar6 = std::operator<<(poVar6," args = new ");
    poVar6 = std::operator<<(poVar6,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,"();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_418);
    local_4f8 = ptVar2;
    for (pptVar9 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar9 !=
        (local_4f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
      t_generator::indent_abi_cxx11_((string *)&local_418,(t_generator *)this);
      poVar6 = std::operator<<((ostream *)os,(string *)&local_418);
      poVar6 = std::operator<<(poVar6,"args.set");
      ptVar8 = (t_javame_generator *)&(*pptVar9)->name_;
      std::__cxx11::string::string((string *)&local_70,(string *)ptVar8);
      get_cap_name((string *)&local_330,ptVar8,&local_70);
      poVar6 = std::operator<<(poVar6,(string *)&local_330);
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = std::operator<<(poVar6,(string *)&(*pptVar9)->name_);
      poVar6 = std::operator<<(poVar6,");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_418);
    }
    t_generator::indent_abi_cxx11_((string *)&local_418,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)os,(string *)&local_418);
    poVar6 = std::operator<<(poVar6,"args.write(oprot_);");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&local_330,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_330);
    poVar6 = std::operator<<(poVar6,"oprot_.writeMessageEnd();");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_4f0,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_4f0);
    poVar6 = std::operator<<(poVar6,"oprot_.getTransport().flush();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_418);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
    if ((*pptVar10)->oneway_ == false) {
      std::operator+(&local_4f0,&(*pptVar10)->name_,"_result");
      t_struct::t_struct(&local_418,(this->super_t_oop_generator).super_t_generator.program_);
      ptVar3 = (*pptVar10)->returntype_;
      std::__cxx11::string::string((string *)&local_558,"recv_",(allocator *)&local_538);
      std::operator+(&local_90,&local_558,&(*pptVar10)->name_);
      t_function::t_function(&local_330,ptVar3,&local_90,&local_418,(*pptVar10)->xceptions_,false);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_558);
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar6 = std::operator<<(poVar6,"public ");
      std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_538);
      function_signature(&local_558,this,&local_330,&local_f0);
      poVar6 = std::operator<<(poVar6,(string *)&local_558);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_558);
      std::__cxx11::string::~string((string *)&local_f0);
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
      t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
      poVar6 = std::operator<<((ostream *)os,(string *)&local_558);
      poVar6 = std::operator<<(poVar6,"TMessage msg = iprot_.readMessageBegin();");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_538,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_538);
      poVar6 = std::operator<<(poVar6,"if (msg.type == TMessageType.EXCEPTION) {");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_518);
      poVar6 = std::operator<<(poVar6,
                               "  TApplicationException x = TApplicationException.read(iprot_);");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_4b8);
      poVar6 = std::operator<<(poVar6,"  iprot_.readMessageEnd();");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_350);
      poVar6 = std::operator<<(poVar6,"  throw x;");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_110);
      poVar6 = std::operator<<(poVar6,"}");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_130);
      poVar6 = std::operator<<(poVar6,"if (msg.seqid != seqid_) {");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_150);
      poVar6 = std::operator<<(poVar6,
                               "  throw new TApplicationException(TApplicationException.BAD_SEQUENCE_ID, \""
                              );
      poVar6 = std::operator<<(poVar6,(string *)&(*pptVar10)->name_);
      poVar6 = std::operator<<(poVar6," failed: out of sequence response\");");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_170);
      poVar6 = std::operator<<(poVar6,"}");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_190);
      poVar6 = std::operator<<(poVar6,(string *)&local_4f0);
      poVar6 = std::operator<<(poVar6," result = new ");
      poVar6 = std::operator<<(poVar6,(string *)&local_4f0);
      poVar6 = std::operator<<(poVar6,"();");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_1b0);
      poVar6 = std::operator<<(poVar6,"result.read(iprot_);");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_1d0);
      poVar6 = std::operator<<(poVar6,"iprot_.readMessageEnd();");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_558);
      iVar5 = (*((*pptVar10)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar5 == '\0') {
        t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)os,(string *)&local_558);
        poVar6 = std::operator<<(poVar6,"if (result.");
        ptVar8 = (t_javame_generator *)0x2f8d6c;
        std::__cxx11::string::string((string *)&local_1f0,"success",(allocator *)&local_350);
        generate_isset_check(&local_538,ptVar8,&local_1f0);
        poVar6 = std::operator<<(poVar6,(string *)&local_538);
        poVar6 = std::operator<<(poVar6,") {");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_518);
        poVar6 = std::operator<<(poVar6,"  return result.success;");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_4b8);
        poVar6 = std::operator<<(poVar6,"}");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)&local_518);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_558);
      }
      ptVar2 = (*pptVar10)->xceptions_;
      for (pptVar9 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar9 !=
          (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
        t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)os,(string *)&local_558);
        poVar6 = std::operator<<(poVar6,"if (result.");
        poVar6 = std::operator<<(poVar6,(string *)&(*pptVar9)->name_);
        poVar6 = std::operator<<(poVar6," != null) {");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_538,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_538);
        poVar6 = std::operator<<(poVar6,"  throw result.");
        poVar6 = std::operator<<(poVar6,(string *)&(*pptVar9)->name_);
        poVar6 = std::operator<<(poVar6,";");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_518);
        poVar6 = std::operator<<(poVar6,"}");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_518);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::~string((string *)&local_558);
      }
      iVar5 = (*((*pptVar10)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar5 == '\0') {
        t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)os,(string *)&local_558);
        poVar6 = std::operator<<(poVar6,
                                 "throw new TApplicationException(TApplicationException.MISSING_RESULT, \""
                                );
        poVar6 = std::operator<<(poVar6,(string *)&(*pptVar10)->name_);
        poVar6 = std::operator<<(poVar6," failed: unknown result\");");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_558);
      }
      else {
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar6 = std::operator<<(poVar6,"return;");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
      std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
      t_function::~t_function(&local_330);
      t_struct::~t_struct(&local_418);
      std::__cxx11::string::~string((string *)&local_4f0);
    }
    std::__cxx11::string::~string((string *)&local_458);
    t_function::~t_function(&local_290);
    std::__cxx11::string::~string(local_498);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_4d0);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string((string *)&local_478);
  return;
}

Assistant:

void t_javame_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_client = " extends " + extends + ".Client";
  }

  indent(f_service_) << "public static class Client" << extends_client
                     << " implements TServiceClient, Iface {" << endl;
  indent_up();

  indent(f_service_) << "public Client(TProtocol prot)" << endl;
  scope_up(f_service_);
  indent(f_service_) << "this(prot, prot);" << endl;
  scope_down(f_service_);
  f_service_ << endl;

  indent(f_service_) << "public Client(TProtocol iprot, TProtocol oprot)" << endl;
  scope_up(f_service_);
  if (extends.empty()) {
    f_service_ << indent() << "iprot_ = iprot;" << endl << indent() << "oprot_ = oprot;" << endl;
  } else {
    f_service_ << indent() << "super(iprot, oprot);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  if (extends.empty()) {
    f_service_ << indent() << "protected TProtocol iprot_;" << endl << indent()
               << "protected TProtocol oprot_;" << endl << endl << indent()
               << "protected int seqid_;" << endl << endl;

    indent(f_service_) << "public TProtocol getInputProtocol()" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.iprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;

    indent(f_service_) << "public TProtocol getOutputProtocol()" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.oprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();

    // Open function
    indent(f_service_) << "public " << function_signature(*f_iter) << endl;
    scope_up(f_service_);
    indent(f_service_) << "send_" << funname << "(";

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    // Declare the function arguments
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    bool first = true;
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << (*fld_iter)->get_name();
    }
    f_service_ << ");" << endl;

    if (!(*f_iter)->is_oneway()) {
      f_service_ << indent();
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << "return ";
      }
      f_service_ << "recv_" << funname << "();" << endl;
    }
    scope_down(f_service_);
    f_service_ << endl;

    t_function send_function(g_type_void,
                             string("send_") + (*f_iter)->get_name(),
                             (*f_iter)->get_arglist());

    string argsname = (*f_iter)->get_name() + "_args";

    // Open function
    indent(f_service_) << "public " << function_signature(&send_function) << endl;
    scope_up(f_service_);

    // Serialize the request
    f_service_ << indent() << "oprot_.writeMessageBegin(new TMessage(\"" << funname << "\", "
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
               << ", ++seqid_));" << endl << indent() << argsname << " args = new " << argsname
               << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args.set" << get_cap_name((*fld_iter)->get_name()) << "("
                 << (*fld_iter)->get_name() << ");" << endl;
    }

    f_service_ << indent() << "args.write(oprot_);" << endl << indent()
               << "oprot_.writeMessageEnd();" << endl << indent()
               << "oprot_.getTransport().flush();" << endl;

    scope_down(f_service_);
    f_service_ << endl;

    if (!(*f_iter)->is_oneway()) {
      string resultname = (*f_iter)->get_name() + "_result";

      t_struct noargs(program_);
      t_function recv_function((*f_iter)->get_returntype(),
                               string("recv_") + (*f_iter)->get_name(),
                               &noargs,
                               (*f_iter)->get_xceptions());
      // Open function
      indent(f_service_) << "public " << function_signature(&recv_function) << endl;
      scope_up(f_service_);

      f_service_ << indent() << "TMessage msg = iprot_.readMessageBegin();" << endl << indent()
                 << "if (msg.type == TMessageType.EXCEPTION) {" << endl << indent()
                 << "  TApplicationException x = TApplicationException.read(iprot_);" << endl
                 << indent() << "  iprot_.readMessageEnd();" << endl << indent() << "  throw x;"
                 << endl << indent() << "}" << endl << indent() << "if (msg.seqid != seqid_) {"
                 << endl << indent()
                 << "  throw new TApplicationException(TApplicationException.BAD_SEQUENCE_ID, \""
                 << (*f_iter)->get_name() << " failed: out of sequence response\");" << endl
                 << indent() << "}" << endl << indent() << resultname << " result = new "
                 << resultname << "();" << endl << indent() << "result.read(iprot_);" << endl
                 << indent() << "iprot_.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "if (result." << generate_isset_check("success") << ") {" << endl
                   << indent() << "  return result.success;" << endl << indent() << "}" << endl;
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        f_service_ << indent() << "if (result." << (*x_iter)->get_name() << " != null) {" << endl
                   << indent() << "  throw result." << (*x_iter)->get_name() << ";" << endl
                   << indent() << "}" << endl;
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "return;" << endl;
      } else {
        f_service_ << indent()
                   << "throw new TApplicationException(TApplicationException.MISSING_RESULT, \""
                   << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
      }

      // Close function
      scope_down(f_service_);
      f_service_ << endl;
    }
  }

  indent_down();
  indent(f_service_) << "}" << endl;
}